

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniOutputNoConfigurable_Test::~TApp_IniOutputNoConfigurable_Test
          (TApp_IniOutputNoConfigurable_Test *this)

{
  TApp_IniOutputNoConfigurable_Test *this_local;
  
  ~TApp_IniOutputNoConfigurable_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniOutputNoConfigurable) {

    int v1, v2;
    app.add_option("--simple", v1);
    app.add_option("--noconf", v2)->configurable(false);

    args = {"--simple=3", "--noconf=2"};

    run();

    std::string str = app.config_to_str();
    EXPECT_EQ("simple=3\n", str);
}